

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O1

utf8_char_t *
caption_frame_read_char(caption_frame_t *frame,int row,int col,eia608_style_t *style,int *underline)

{
  caption_frame_cell_t *pcVar1;
  
  pcVar1 = (frame->front).cell[(uint)row] + (uint)col;
  if (0x1f < (uint)col || 0xe < (uint)row) {
    if (style != (eia608_style_t *)0x0) {
      *style = eia608_style_white;
    }
    if (underline != (int *)0x0) {
      *underline = 0;
    }
    return "";
  }
  if (style != (eia608_style_t *)0x0) {
    *style = *(uint *)pcVar1 >> 1 & eia608_style_italics;
  }
  if (underline != (int *)0x0) {
    *underline = *(byte *)pcVar1 & 1;
  }
  return pcVar1->data;
}

Assistant:

const utf8_char_t* caption_frame_read_char(caption_frame_t* frame, int row, int col, eia608_style_t* style, int* underline)
{
    // always read from front
    caption_frame_cell_t* cell = frame_buffer_cell(&frame->front, row, col);

    if (!cell) {
        if (style) {
            (*style) = eia608_style_white;
        }

        if (underline) {
            (*underline) = 0;
        }

        return EIA608_CHAR_NULL;
    }

    if (style) {
        (*style) = cell->sty;
    }

    if (underline) {
        (*underline) = cell->uln;
    }

    return &cell->data[0];
}